

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase812::run(TestCase812 *this)

{
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  bool bVar1;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  Builder local_1a0;
  Builder child;
  Builder root;
  Reader local_128;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0,FIXED_SIZE);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField(&child,&root);
  builder_00._builder.capTable = child._builder.capTable;
  builder_00._builder.segment = child._builder.segment;
  builder_00._builder.data = child._builder.data;
  builder_00._builder.pointers = child._builder.pointers;
  builder_00._builder.dataSize = child._builder.dataSize;
  builder_00._builder.pointerCount = child._builder.pointerCount;
  builder_00._builder._38_2_ = child._builder._38_2_;
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructField(&orphan,&root);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField(&root);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x333,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
               (char (*) [42])"failed: expected !(root.hasStructField())");
  }
  if ((orphan.builder.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x334,ERROR,"\"failed: expected \" \"orphan != nullptr\"",
               (char (*) [35])"failed: expected orphan != nullptr");
    if ((orphan.builder.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x335,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
                 (char (*) [38])"failed: expected !(orphan == nullptr)");
    }
  }
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::applyReader
            (&local_128,&orphan.builder);
  reader._reader.capTable = local_128._reader.capTable;
  reader._reader.segment = local_128._reader.segment;
  reader._reader.data = local_128._reader.data;
  reader._reader.pointers = local_128._reader.pointers;
  reader._reader.dataSize = local_128._reader.dataSize;
  reader._reader.pointerCount = local_128._reader.pointerCount;
  reader._reader._38_2_ = local_128._reader._38_2_;
  reader._reader.nestingLimit = local_128._reader.nestingLimit;
  reader._reader._44_4_ = local_128._reader._44_4_;
  checkTestMessage(reader);
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            (&local_1a0,&orphan.builder);
  builder_01._builder.capTable = local_1a0._builder.capTable;
  builder_01._builder.segment = local_1a0._builder.segment;
  builder_01._builder.data = local_1a0._builder.data;
  builder_01._builder.pointers = local_1a0._builder.pointers;
  builder_01._builder.dataSize = local_1a0._builder.dataSize;
  builder_01._builder.pointerCount = local_1a0._builder.pointerCount;
  builder_01._builder._38_2_ = local_1a0._builder._38_2_;
  checkTestMessage(builder_01);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, FarPointer) {
  MallocMessageBuilder builder(0, AllocationStrategy::FIXED_SIZE);
  auto root = builder.initRoot<TestAllTypes>();
  auto child = root.initStructField();
  initTestMessage(child);

  auto orphan = root.disownStructField();
  EXPECT_FALSE(root.hasStructField());
  EXPECT_TRUE(orphan != nullptr);
  EXPECT_FALSE(orphan == nullptr);

  checkTestMessage(orphan.getReader());
  checkTestMessage(orphan.get());
}